

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O2

void amrex::MLABecLaplacian::FFlux
               (Box *box,Real *dxinv,Real bscalar,Array<const_FArrayBox_*,_3> *bcoef,
               Array<FArrayBox_*,_3> *flux,FArrayBox *sol,int face_only,int ncomp)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  FArrayBox *pFVar10;
  FArrayBox *pFVar11;
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  double *pdVar15;
  double *pdVar16;
  undefined8 uVar17;
  int j;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  int iVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  double *pdVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  double *pdVar44;
  int iVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  int iVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  int iVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  long lVar67;
  ulong uVar68;
  long lVar69;
  long lVar70;
  long lVar71;
  long lVar72;
  long lVar73;
  int j_1;
  long lVar74;
  int iVar75;
  int iVar76;
  long lVar77;
  long lVar78;
  ulong uVar79;
  double dVar80;
  double *local_218;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  long local_1d8;
  long local_1d0;
  long local_1c0;
  long local_1b8;
  long local_1a0;
  long local_150;
  
  pFVar10 = bcoef->_M_elems[0];
  pFVar11 = bcoef->_M_elems[1];
  pdVar36 = (pFVar10->super_BaseFab<double>).dptr;
  iVar22 = (pFVar10->super_BaseFab<double>).domain.smallend.vect[0];
  lVar37 = (long)iVar22;
  iVar76 = (pFVar10->super_BaseFab<double>).domain.smallend.vect[1];
  iVar52 = (pFVar10->super_BaseFab<double>).domain.smallend.vect[2];
  lVar60 = (long)(((pFVar10->super_BaseFab<double>).domain.bigend.vect[0] - iVar22) + 1);
  lVar53 = (long)(((pFVar10->super_BaseFab<double>).domain.bigend.vect[1] - iVar76) + 1);
  lVar54 = (long)(((pFVar10->super_BaseFab<double>).domain.bigend.vect[2] - iVar52) + 1);
  pdVar44 = (pFVar11->super_BaseFab<double>).dptr;
  iVar22 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[0];
  lVar69 = (long)iVar22;
  iVar75 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[1];
  lVar38 = (long)iVar75;
  iVar59 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[2];
  lVar61 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[0] - iVar22) + 1);
  lVar55 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[1] - iVar75) + 1);
  lVar23 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[2] - iVar59) + 1);
  pFVar10 = bcoef->_M_elems[2];
  pdVar12 = (pFVar10->super_BaseFab<double>).dptr;
  iVar22 = (pFVar10->super_BaseFab<double>).domain.smallend.vect[0];
  lVar56 = (long)iVar22;
  iVar75 = (pFVar10->super_BaseFab<double>).domain.smallend.vect[1];
  lVar62 = (long)iVar75;
  iVar30 = (pFVar10->super_BaseFab<double>).domain.smallend.vect[2];
  lVar31 = (long)(((pFVar10->super_BaseFab<double>).domain.bigend.vect[0] - iVar22) + 1);
  lVar32 = (long)(((pFVar10->super_BaseFab<double>).domain.bigend.vect[1] - iVar75) + 1);
  lVar24 = (long)(((pFVar10->super_BaseFab<double>).domain.bigend.vect[2] - iVar30) + 1);
  pFVar10 = flux->_M_elems[0];
  pdVar13 = (pFVar10->super_BaseFab<double>).dptr;
  iVar22 = (pFVar10->super_BaseFab<double>).domain.smallend.vect[0];
  lVar57 = (long)iVar22;
  iVar75 = (pFVar10->super_BaseFab<double>).domain.smallend.vect[1];
  iVar1 = (pFVar10->super_BaseFab<double>).domain.smallend.vect[2];
  lVar58 = (long)(((pFVar10->super_BaseFab<double>).domain.bigend.vect[0] - iVar22) + 1);
  lVar77 = (long)(((pFVar10->super_BaseFab<double>).domain.bigend.vect[1] - iVar75) + 1);
  lVar25 = (long)(((pFVar10->super_BaseFab<double>).domain.bigend.vect[2] - iVar1) + 1);
  pFVar10 = flux->_M_elems[1];
  pdVar14 = (pFVar10->super_BaseFab<double>).dptr;
  iVar22 = (pFVar10->super_BaseFab<double>).domain.smallend.vect[0];
  lVar70 = (long)iVar22;
  iVar2 = (pFVar10->super_BaseFab<double>).domain.smallend.vect[1];
  lVar39 = (long)iVar2;
  iVar3 = (pFVar10->super_BaseFab<double>).domain.smallend.vect[2];
  lVar33 = (long)(((pFVar10->super_BaseFab<double>).domain.bigend.vect[0] - iVar22) + 1);
  lVar34 = (long)(((pFVar10->super_BaseFab<double>).domain.bigend.vect[1] - iVar2) + 1);
  lVar26 = (long)(((pFVar10->super_BaseFab<double>).domain.bigend.vect[2] - iVar3) + 1);
  pFVar10 = flux->_M_elems[2];
  pdVar15 = (pFVar10->super_BaseFab<double>).dptr;
  iVar22 = (pFVar10->super_BaseFab<double>).domain.smallend.vect[0];
  lVar71 = (long)iVar22;
  iVar2 = (pFVar10->super_BaseFab<double>).domain.smallend.vect[1];
  lVar63 = (long)iVar2;
  iVar4 = (pFVar10->super_BaseFab<double>).domain.smallend.vect[2];
  lVar27 = (long)(((pFVar10->super_BaseFab<double>).domain.bigend.vect[0] - iVar22) + 1);
  lVar28 = (long)(((pFVar10->super_BaseFab<double>).domain.bigend.vect[1] - iVar2) + 1);
  lVar18 = (long)(((pFVar10->super_BaseFab<double>).domain.bigend.vect[2] - iVar4) + 1);
  pdVar16 = (sol->super_BaseFab<double>).dptr;
  uVar5 = (sol->super_BaseFab<double>).domain.smallend.vect[0];
  lVar41 = (long)(int)uVar5;
  uVar6 = (sol->super_BaseFab<double>).domain.smallend.vect[1];
  lVar64 = (long)(int)uVar6;
  uVar7 = (sol->super_BaseFab<double>).domain.smallend.vect[2];
  lVar40 = (long)(int)uVar7;
  lVar19 = (long)(int)(((sol->super_BaseFab<double>).domain.bigend.vect[0] - uVar5) + 1);
  lVar78 = (long)(int)(((sol->super_BaseFab<double>).domain.bigend.vect[1] - uVar6) + 1);
  lVar72 = lVar78 * lVar19;
  lVar20 = (int)(((sol->super_BaseFab<double>).domain.bigend.vect[2] - uVar7) + 1) * lVar72;
  dVar80 = *dxinv;
  if (face_only == 0) {
    iVar22 = (box->smallend).vect[0];
    lVar47 = (long)iVar22;
    lVar49 = (long)(box->smallend).vect[1];
    lVar50 = (long)(box->smallend).vect[2];
    iVar2 = (box->bigend).vect[1];
    uVar8 = (box->btype).itype;
    iVar45 = (~uVar8 & 1) + (box->bigend).vect[0];
    if (ncomp < 1) {
      ncomp = 0;
    }
    uVar79 = (ulong)(uint)ncomp;
    lVar35 = lVar49 * 8;
    iVar9 = (box->bigend).vect[2];
    lVar65 = (long)pdVar36 +
             (lVar35 + (lVar50 - iVar52) * lVar53 * 8 + (long)iVar76 * -8) * lVar60 + lVar47 * 8 +
             lVar37 * -8;
    local_150 = (lVar35 + (lVar50 - lVar40) * lVar78 * 8 + lVar64 * -8) * lVar19 + lVar47 * 8 +
                lVar41 * -8 + (long)pdVar16;
    lVar37 = lVar20 * 8;
    lVar46 = lVar72 * 8;
    lVar48 = lVar19 * 8;
    lVar57 = (long)pdVar13 +
             (lVar35 + (lVar50 - iVar1) * lVar77 * 8 + (long)iVar75 * -8) * lVar58 + lVar47 * 8 +
             lVar57 * -8;
    for (uVar68 = 0; uVar68 != uVar79; uVar68 = uVar68 + 1) {
      lVar35 = local_150;
      lVar66 = lVar57;
      local_218 = (double *)lVar65;
      for (lVar47 = lVar50; lVar47 <= iVar9; lVar47 = lVar47 + 1) {
        pdVar36 = local_218;
        lVar43 = lVar35;
        lVar51 = lVar66;
        for (lVar74 = lVar49; lVar74 <= iVar2; lVar74 = lVar74 + 1) {
          if (iVar22 <= iVar45) {
            lVar73 = 0;
            do {
              *(double *)(lVar51 + lVar73 * 8) =
                   (*(double *)(lVar43 + lVar73 * 8) -
                   pdVar16[lVar20 * uVar68 +
                           (lVar47 - lVar40) * lVar72 +
                           (lVar74 - lVar64) * lVar19 + (long)(int)((int)lVar73 + ~uVar5 + iVar22)])
                   * *(double *)((long)pdVar36 + lVar73 * 8) * -dVar80 * bscalar;
              lVar73 = lVar73 + 1;
            } while ((iVar45 - iVar22) + 1 != (int)lVar73);
          }
          pdVar36 = (double *)((long)pdVar36 + lVar60 * 8);
          lVar43 = lVar43 + lVar48;
          lVar51 = lVar51 + lVar58 * 8;
        }
        local_218 = (double *)((long)local_218 + lVar53 * lVar60 * 8);
        lVar35 = lVar35 + lVar46;
        lVar66 = lVar66 + lVar77 * lVar58 * 8;
      }
      lVar65 = lVar65 + lVar54 * lVar53 * lVar60 * 8;
      local_150 = local_150 + lVar37;
      lVar57 = lVar57 + lVar25 * lVar77 * lVar58 * 8;
    }
    iVar22 = (box->smallend).vect[0];
    lVar53 = (long)iVar22;
    iVar76 = (box->smallend).vect[1];
    iVar52 = (box->bigend).vect[1];
    lVar57 = (long)(box->smallend).vect[2];
    lVar25 = (long)iVar76 * 8;
    iVar75 = (box->bigend).vect[0];
    dVar80 = dxinv[1];
    iVar1 = (box->bigend).vect[2];
    lVar54 = (long)pdVar44 +
             (lVar25 + (lVar57 - iVar59) * lVar55 * 8 + lVar38 * -8) * lVar61 + lVar53 * 8 +
             lVar69 * -8;
    lVar58 = (lVar57 - lVar40) * lVar78;
    lVar38 = (lVar25 + lVar58 * 8 + lVar64 * -8) * lVar19 + lVar53 * 8 + lVar41 * -8 + (long)pdVar16
    ;
    pdVar36 = pdVar16 + (lVar53 - lVar41);
    lVar25 = (long)pdVar14 +
             (lVar25 + (lVar57 - iVar3) * lVar34 * 8 + lVar39 * -8) * lVar33 + lVar53 * 8 +
             lVar70 * -8;
    for (uVar68 = 0; lVar39 = lVar25, pdVar44 = pdVar36, lVar53 = lVar38, lVar60 = lVar57,
        lVar69 = lVar54, uVar68 != uVar79; uVar68 = uVar68 + 1) {
      for (; lVar70 = lVar39, lVar77 = lVar53, lVar47 = (long)iVar76, lVar50 = lVar69,
          iVar59 = ~uVar6 + iVar76, lVar60 <= iVar1; lVar60 = lVar60 + 1) {
        for (; lVar47 <= (int)(iVar52 + (uint)((uVar8 & 2) == 0)); lVar47 = lVar47 + 1) {
          if (iVar22 <= iVar75) {
            lVar49 = 0;
            do {
              *(double *)(lVar70 + lVar49 * 8) =
                   (*(double *)(lVar77 + lVar49 * 8) -
                   *(double *)
                    ((long)pdVar44 + lVar49 * 8 + (lVar58 * 8 + (long)iVar59 * 8) * lVar19)) *
                   *(double *)(lVar50 + lVar49 * 8) * -dVar80 * bscalar;
              lVar49 = lVar49 + 1;
            } while ((iVar75 - iVar22) + 1 != (int)lVar49);
          }
          lVar50 = lVar50 + lVar61 * 8;
          lVar77 = lVar77 + lVar48;
          iVar59 = iVar59 + 1;
          lVar70 = lVar70 + lVar33 * 8;
        }
        lVar39 = lVar39 + lVar34 * lVar33 * 8;
        pdVar44 = pdVar44 + lVar72;
        lVar53 = lVar53 + lVar46;
        lVar69 = lVar69 + lVar55 * lVar61 * 8;
      }
      lVar54 = lVar54 + lVar23 * lVar55 * lVar61 * 8;
      lVar38 = lVar38 + lVar37;
      pdVar36 = pdVar36 + lVar20;
      lVar25 = lVar25 + lVar26 * lVar34 * lVar33 * 8;
    }
    lVar25 = (long)(box->smallend).vect[1];
    iVar22 = (box->bigend).vect[2];
    iVar76 = (box->smallend).vect[2];
    lVar26 = (long)iVar76;
    dVar80 = dxinv[2];
    lVar72 = lVar25 * 8;
    iVar52 = (box->smallend).vect[0];
    lVar23 = (long)iVar52;
    lVar33 = (long)pdVar12 +
             (lVar72 + (lVar26 - iVar30) * lVar32 * 8 + lVar62 * -8) * lVar31 + lVar23 * 8 +
             lVar56 * -8;
    local_218 = pdVar16 + (lVar23 - lVar41);
    lVar34 = (lVar72 + (lVar26 - lVar40) * lVar78 * 8 + lVar64 * -8) * lVar19 + lVar23 * 8 +
             lVar41 * -8 + (long)pdVar16;
    iVar75 = (box->bigend).vect[0];
    iVar59 = (box->bigend).vect[1];
    lVar23 = (long)pdVar15 +
             (lVar72 + (lVar26 - iVar4) * lVar28 * 8 + lVar63 * -8) * lVar27 + lVar23 * 8 +
             lVar71 * -8;
    for (uVar68 = 0; lVar38 = lVar26, lVar39 = lVar23, lVar40 = lVar33, lVar41 = lVar34,
        iVar30 = ~uVar7 + iVar76, uVar68 != uVar79; uVar68 = uVar68 + 1) {
      for (; lVar38 <= (int)(iVar22 + (uint)((uVar8 & 4) == 0)); lVar38 = lVar38 + 1) {
        pdVar36 = (double *)
                  (((long)iVar30 * lVar78 * 8 + lVar72 + lVar64 * -8) * lVar19 + (long)local_218);
        lVar53 = lVar40;
        lVar54 = lVar39;
        lVar55 = lVar41;
        for (lVar56 = lVar25; lVar56 <= iVar59; lVar56 = lVar56 + 1) {
          if (iVar52 <= iVar75) {
            lVar57 = 0;
            do {
              *(double *)(lVar54 + lVar57 * 8) =
                   (*(double *)(lVar55 + lVar57 * 8) - pdVar36[lVar57]) *
                   *(double *)(lVar53 + lVar57 * 8) * -dVar80 * bscalar;
              lVar57 = lVar57 + 1;
            } while ((iVar75 - iVar52) + 1 != (int)lVar57);
          }
          lVar53 = lVar53 + lVar31 * 8;
          pdVar36 = pdVar36 + lVar19;
          lVar55 = lVar55 + lVar48;
          lVar54 = lVar54 + lVar27 * 8;
        }
        lVar39 = lVar39 + lVar28 * lVar27 * 8;
        lVar40 = lVar40 + lVar32 * lVar31 * 8;
        lVar41 = lVar41 + lVar46;
        iVar30 = iVar30 + 1;
      }
      lVar33 = lVar33 + lVar24 * lVar32 * lVar31 * 8;
      local_218 = local_218 + lVar20;
      lVar34 = lVar34 + lVar37;
      lVar23 = lVar23 + lVar18 * lVar28 * lVar27 * 8;
    }
  }
  else {
    lVar47 = *(long *)(box->smallend).vect;
    lVar50 = *(long *)(box->bigend).vect;
    iVar22 = (int)lVar47;
    lVar47 = lVar47 >> 0x20;
    local_1d8 = 0;
    if (ncomp < 1) {
      ncomp = 0;
    }
    uVar79 = (ulong)(uint)ncomp;
    lVar65 = (long)(box->smallend).vect[2];
    lVar49 = lVar47 * 8;
    lVar46 = (long)iVar22;
    lVar48 = (lVar49 + (lVar65 - iVar1) * lVar77 * 8 + (long)iVar75 * -8) * lVar58;
    iVar75 = (int)lVar50;
    lVar35 = (long)(iVar75 + 1);
    local_1a0 = lVar48 + lVar35 * 8 + lVar57 * -8 + (long)pdVar13;
    local_1d0 = lVar48 + lVar46 * 8 + lVar57 * -8 + (long)pdVar13;
    lVar66 = (lVar49 + (lVar65 - lVar40) * lVar78 * 8 + lVar64 * -8) * lVar19;
    lVar49 = (lVar49 + (lVar65 - iVar52) * lVar53 * 8 + (long)iVar76 * -8) * lVar60;
    iVar76 = (box->bigend).vect[2];
    dVar80 = -dVar80 * bscalar;
    lVar48 = lVar25 * lVar77 * lVar58 * 8;
    lVar77 = lVar77 * lVar58 * 8;
    lVar20 = lVar20 * 8;
    lVar72 = lVar72 * 8;
    lVar57 = lVar49 + lVar35 * 8 + lVar37 * -8 + (long)pdVar36;
    local_1e8 = lVar49 + lVar46 * 8 + lVar37 * -8 + (long)pdVar36;
    lVar25 = lVar19 * 8;
    lVar54 = lVar54 * lVar53 * lVar60 * 8;
    lVar37 = lVar53 * lVar60 * 8;
    for (uVar68 = 0; lVar53 = local_1e8, lVar49 = local_1d8, lVar43 = local_1a0, lVar51 = lVar65,
        lVar74 = lVar57, lVar73 = local_1d0, uVar68 != uVar79; uVar68 = uVar68 + 1) {
      for (; lVar51 <= iVar76; lVar51 = lVar51 + 1) {
        lVar67 = 0;
        lVar29 = 0;
        lVar42 = lVar49;
        for (lVar21 = lVar47; lVar21 <= lVar50 >> 0x20; lVar21 = lVar21 + 1) {
          *(double *)(lVar73 + lVar29) =
               (*(double *)((long)pdVar16 + lVar42 + lVar66 + lVar46 * 8 + lVar41 * -8) -
               *(double *)((long)pdVar16 + lVar42 + lVar66 + (long)(int)(~uVar5 + iVar22) * 8)) *
               *(double *)(lVar53 + lVar67) * dVar80;
          *(double *)(lVar43 + lVar29) =
               (*(double *)((long)pdVar16 + lVar42 + lVar66 + lVar35 * 8 + lVar41 * -8) -
               *(double *)((long)pdVar16 + lVar42 + lVar66 + (long)(int)(iVar75 - uVar5) * 8)) *
               *(double *)(lVar74 + lVar67) * dVar80;
          lVar29 = lVar29 + lVar58 * 8;
          lVar42 = lVar42 + lVar25;
          lVar67 = lVar67 + lVar60 * 8;
        }
        lVar53 = lVar53 + lVar37;
        lVar49 = lVar49 + lVar72;
        lVar43 = lVar43 + lVar77;
        lVar74 = lVar74 + lVar37;
        lVar73 = lVar73 + lVar77;
      }
      local_1a0 = local_1a0 + lVar48;
      local_1d0 = local_1d0 + lVar48;
      local_1d8 = local_1d8 + lVar20;
      lVar57 = lVar57 + lVar54;
      local_1e8 = local_1e8 + lVar54;
    }
    lVar54 = (long)(box->smallend).vect[2];
    lVar37 = *(long *)(box->smallend).vect;
    uVar17 = *(undefined8 *)(box->bigend).vect;
    lVar57 = (lVar54 - iVar59) * lVar55;
    lVar58 = (lVar37 >> 0x20) * 8;
    iVar76 = (int)((ulong)uVar17 >> 0x20);
    lVar77 = (long)(iVar76 + 1) * 8;
    iVar52 = (int)lVar37;
    lVar53 = (long)iVar52;
    lVar47 = (lVar58 + lVar57 * 8 + lVar38 * -8) * lVar61 + lVar53 * 8 + lVar69 * -8 + (long)pdVar44
    ;
    lVar57 = (lVar77 + lVar57 * 8 + lVar38 * -8) * lVar61 + lVar53 * 8 + lVar69 * -8 + (long)pdVar44
    ;
    lVar40 = (lVar54 - lVar40) * lVar78;
    lVar69 = (lVar54 - iVar3) * lVar34;
    dVar80 = dxinv[1];
    iVar75 = (int)uVar17;
    iVar22 = (box->bigend).vect[2];
    lVar23 = lVar23 * lVar55 * lVar61 * 8;
    lVar60 = lVar55 * lVar61 * 8;
    local_1f0 = (lVar58 + lVar40 * 8 + lVar64 * -8) * lVar19 + lVar53 * 8 + lVar41 * -8 +
                (long)pdVar16;
    lVar61 = ((long)(int)(~uVar6 + (int)((ulong)lVar37 >> 0x20)) * 8 + lVar40 * 8) * lVar19 +
             lVar53 * 8 + lVar41 * -8 + (long)pdVar16;
    lVar58 = (lVar58 + lVar69 * 8 + lVar39 * -8) * lVar33 + lVar53 * 8 + lVar70 * -8 + (long)pdVar14
    ;
    lVar37 = lVar26 * lVar34 * lVar33 * 8;
    lVar38 = lVar34 * lVar33 * 8;
    iVar59 = (iVar75 - iVar52) + 1;
    lVar55 = (lVar77 + lVar40 * 8 + lVar64 * -8) * lVar19 + lVar53 * 8 + lVar41 * -8 + (long)pdVar16
    ;
    lVar34 = ((long)(int)(iVar76 - uVar6) * 8 + lVar40 * 8) * lVar19 + lVar53 * 8 + lVar41 * -8 +
             (long)pdVar16;
    lVar26 = (lVar77 + lVar69 * 8 + lVar39 * -8) * lVar33 + lVar53 * 8 + lVar70 * -8 + (long)pdVar14
    ;
    for (uVar68 = 0; lVar33 = lVar47, lVar39 = lVar57, lVar40 = lVar34, lVar53 = lVar55,
        lVar69 = lVar54, lVar70 = local_1f0, lVar77 = lVar58, lVar50 = lVar61, lVar49 = lVar26,
        uVar68 != uVar79; uVar68 = uVar68 + 1) {
      for (; lVar69 <= iVar22; lVar69 = lVar69 + 1) {
        if (iVar52 <= iVar75) {
          lVar35 = 0;
          do {
            *(double *)(lVar77 + lVar35 * 8) =
                 (*(double *)(lVar70 + lVar35 * 8) - *(double *)(lVar50 + lVar35 * 8)) *
                 *(double *)(lVar33 + lVar35 * 8) * -dVar80 * bscalar;
            lVar35 = lVar35 + 1;
          } while (iVar59 != (int)lVar35);
          if (iVar52 <= iVar75) {
            lVar35 = 0;
            do {
              *(double *)(lVar49 + lVar35 * 8) =
                   (*(double *)(lVar53 + lVar35 * 8) - *(double *)(lVar40 + lVar35 * 8)) *
                   *(double *)(lVar39 + lVar35 * 8) * -dVar80 * bscalar;
              lVar35 = lVar35 + 1;
            } while (iVar59 != (int)lVar35);
          }
        }
        lVar33 = lVar33 + lVar60;
        lVar39 = lVar39 + lVar60;
        lVar40 = lVar40 + lVar72;
        lVar53 = lVar53 + lVar72;
        lVar70 = lVar70 + lVar72;
        lVar77 = lVar77 + lVar38;
        lVar50 = lVar50 + lVar72;
        lVar49 = lVar49 + lVar38;
      }
      lVar47 = lVar47 + lVar23;
      local_1f0 = local_1f0 + lVar20;
      lVar61 = lVar61 + lVar20;
      lVar58 = lVar58 + lVar37;
      lVar57 = lVar57 + lVar23;
      lVar55 = lVar55 + lVar20;
      lVar34 = lVar34 + lVar20;
      lVar26 = lVar26 + lVar37;
    }
    dVar80 = dxinv[2];
    iVar76 = (box->smallend).vect[2];
    iVar75 = iVar22 + 1;
    lVar23 = *(long *)(box->smallend).vect;
    lVar26 = lVar23 >> 0x20;
    lVar72 = lVar26 * 8;
    iVar52 = (int)lVar23;
    lVar23 = (long)iVar52;
    lVar37 = (lVar72 + (iVar76 - iVar30) * lVar32 * 8 + lVar62 * -8) * lVar31 + lVar23 * 8 +
             lVar56 * -8 + (long)pdVar12;
    local_1b8 = (lVar72 + (iVar75 - iVar30) * lVar32 * 8 + lVar62 * -8) * lVar31 + lVar23 * 8 +
                lVar56 * -8 + (long)pdVar12;
    local_1c0 = (lVar72 + (int)(~uVar7 + iVar76) * lVar78 * 8 + lVar64 * -8) * lVar19 + lVar23 * 8 +
                lVar41 * -8 + (long)pdVar16;
    lVar34 = (lVar72 + (int)(iVar76 - uVar7) * lVar78 * 8 + lVar64 * -8) * lVar19 + lVar23 * 8 +
             lVar41 * -8 + (long)pdVar16;
    local_1f8 = (lVar72 + (int)(iVar22 - uVar7) * lVar78 * 8 + lVar64 * -8) * lVar19 + lVar23 * 8 +
                lVar41 * -8 + (long)pdVar16;
    local_218 = (double *)
                ((lVar72 + (int)(iVar75 - uVar7) * lVar78 * 8 + lVar64 * -8) * lVar19 + lVar23 * 8 +
                 lVar41 * -8 + (long)pdVar16);
    lVar19 = *(long *)(box->bigend).vect;
    iVar22 = (int)lVar19;
    lVar33 = (lVar72 + (iVar76 - iVar4) * lVar28 * 8 + lVar63 * -8) * lVar27 + lVar23 * 8 +
             lVar71 * -8 + (long)pdVar15;
    lVar23 = (lVar72 + (iVar75 - iVar4) * lVar28 * 8 + lVar63 * -8) * lVar27 + lVar23 * 8 +
             lVar71 * -8 + (long)pdVar15;
    lVar19 = lVar19 >> 0x20;
    lVar72 = lVar32 * lVar31 * lVar24 * 8;
    lVar18 = lVar28 * lVar27 * lVar18 * 8;
    iVar76 = (iVar22 - iVar52) + 1;
    for (uVar68 = 0; lVar24 = local_1c0, lVar28 = lVar33, lVar32 = lVar34, lVar38 = lVar26,
        lVar39 = lVar37, uVar68 != uVar79; uVar68 = uVar68 + 1) {
      for (; lVar40 = lVar26, lVar41 = lVar23, lVar53 = local_1b8, pdVar36 = local_218,
          lVar54 = local_1f8, lVar38 <= lVar19; lVar38 = lVar38 + 1) {
        if (iVar52 <= iVar22) {
          lVar40 = 0;
          do {
            *(double *)(lVar28 + lVar40 * 8) =
                 (*(double *)(lVar32 + lVar40 * 8) - *(double *)(lVar24 + lVar40 * 8)) *
                 *(double *)(lVar39 + lVar40 * 8) * -dVar80 * bscalar;
            lVar40 = lVar40 + 1;
          } while (iVar76 != (int)lVar40);
        }
        lVar24 = lVar24 + lVar25;
        lVar28 = lVar28 + lVar27 * 8;
        lVar32 = lVar32 + lVar25;
        lVar39 = lVar39 + lVar31 * 8;
      }
      for (; lVar40 <= lVar19; lVar40 = lVar40 + 1) {
        if (iVar52 <= iVar22) {
          lVar24 = 0;
          do {
            *(double *)(lVar41 + lVar24 * 8) =
                 (*(double *)((long)pdVar36 + lVar24 * 8) - *(double *)(lVar54 + lVar24 * 8)) *
                 *(double *)(lVar53 + lVar24 * 8) * -dVar80 * bscalar;
            lVar24 = lVar24 + 1;
          } while (iVar76 != (int)lVar24);
        }
        lVar41 = lVar41 + lVar27 * 8;
        lVar53 = lVar53 + lVar31 * 8;
        pdVar36 = (double *)((long)pdVar36 + lVar25);
        lVar54 = lVar54 + lVar25;
      }
      lVar37 = lVar37 + lVar72;
      local_1c0 = local_1c0 + lVar20;
      lVar34 = lVar34 + lVar20;
      lVar33 = lVar33 + lVar18;
      local_1b8 = local_1b8 + lVar72;
      local_1f8 = local_1f8 + lVar20;
      local_218 = (double *)((long)local_218 + lVar20);
      lVar23 = lVar23 + lVar18;
    }
  }
  return;
}

Assistant:

void
MLABecLaplacian::FFlux (Box const& box, Real const* dxinv, Real bscalar,
                        Array<FArrayBox const*, AMREX_SPACEDIM> const& bcoef,
                        Array<FArrayBox*,AMREX_SPACEDIM> const& flux,
                        FArrayBox const& sol, int face_only, int ncomp)
{
    AMREX_D_TERM(const auto bx = bcoef[0]->const_array();,
                 const auto by = bcoef[1]->const_array();,
                 const auto bz = bcoef[2]->const_array(););
    AMREX_D_TERM(const auto& fxarr = flux[0]->array();,
                 const auto& fyarr = flux[1]->array();,
                 const auto& fzarr = flux[2]->array(););
    const auto& solarr = sol.array();

    if (face_only)
    {
        Real fac = bscalar*dxinv[0];
        Box blo = amrex::bdryLo(box, 0);
        int blen = box.length(0);
        AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( blo, tbox,
        {
            mlabeclap_flux_xface(tbox, fxarr, solarr, bx, fac, blen, ncomp);
        });
#if (AMREX_SPACEDIM >= 2)
        fac = bscalar*dxinv[1];
        blo = amrex::bdryLo(box, 1);
        blen = box.length(1);
        AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( blo, tbox,
        {
            mlabeclap_flux_yface(tbox, fyarr, solarr, by, fac, blen, ncomp);
        });
#endif
#if (AMREX_SPACEDIM == 3)
        fac = bscalar*dxinv[2];
        blo = amrex::bdryLo(box, 2);
        blen = box.length(2);
        AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( blo, tbox,
        {
            mlabeclap_flux_zface(tbox, fzarr, solarr, bz, fac, blen, ncomp);
        });
#endif
    }
    else
    {
        Real fac = bscalar*dxinv[0];
        Box bflux = amrex::surroundingNodes(box, 0);
        AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bflux, tbox,
        {
            mlabeclap_flux_x(tbox, fxarr, solarr, bx, fac, ncomp);
        });
#if (AMREX_SPACEDIM >= 2)
        fac = bscalar*dxinv[1];
        bflux = amrex::surroundingNodes(box, 1);
        AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bflux, tbox,
        {
            mlabeclap_flux_y(tbox, fyarr, solarr, by, fac, ncomp);
        });
#endif
#if (AMREX_SPACEDIM == 3)
        fac = bscalar*dxinv[2];
        bflux = amrex::surroundingNodes(box, 2);
        AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bflux, tbox,
        {
            mlabeclap_flux_z(tbox, fzarr, solarr, bz, fac, ncomp);
        });
#endif
    }
}